

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_6::fillSampleCountFromCache(int y,Data *data)

{
  int iVar1;
  int xStride_00;
  int yStride_00;
  uint uVar2;
  char *base_00;
  uint *puVar3;
  long in_RSI;
  int in_EDI;
  uint count;
  int x;
  int yStride;
  int xStride;
  char *base;
  int yInDataWindow;
  int local_2c;
  
  iVar1 = *(int *)(in_RSI + 0xdc);
  base_00 = *(char **)(in_RSI + 0x1c0);
  xStride_00 = *(int *)(in_RSI + 0x1c8);
  yStride_00 = *(int *)(in_RSI + 0x1cc);
  for (local_2c = *(int *)(in_RSI + 0xd4); local_2c <= *(int *)(in_RSI + 0xd8);
      local_2c = local_2c + 1) {
    puVar3 = Array2D<unsigned_int>::operator[]
                       ((Array2D<unsigned_int> *)(in_RSI + 0x188),(long)(in_EDI - iVar1));
    uVar2 = puVar3[local_2c - *(int *)(in_RSI + 0xd4)];
    puVar3 = (uint *)sampleCount(base_00,xStride_00,yStride_00,local_2c,in_EDI);
    *puVar3 = uVar2;
  }
  return;
}

Assistant:

void
fillSampleCountFromCache(int y, DeepScanLineInputFile::Data* data)
{
    int yInDataWindow = y - data->minY;
    char* base = data->sampleCountSliceBase;
    int xStride = data->sampleCountXStride;
    int yStride = data->sampleCountYStride;
    
    for (int x = data->minX; x <= data->maxX; x++)
    {
        unsigned int count = data->sampleCount[yInDataWindow][x - data->minX];    
        sampleCount(base, xStride, yStride, x, y) = count;
    }
}